

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,RegList l)

{
  uint uVar1;
  char *pcVar2;
  int i_1;
  int i;
  long lVar3;
  Rn rn;
  bool bVar4;
  int r [16];
  undefined8 uStack_70;
  uint local_68 [18];
  
  lVar3 = 0;
  do {
    local_68[lVar3] = (uint)((l.raw >> ((uint)lVar3 & 0x1f) & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 1;
  do {
    if (local_68[lVar3] != 0) {
      local_68[lVar3] = *(int *)((long)&uStack_70 + lVar3 * 4 + 4) + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 0xe;
  do {
    if ((local_68[lVar3] != 0) && (local_68[lVar3 + 1] != 0)) {
      local_68[lVar3] = local_68[lVar3 + 1];
    }
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  bVar4 = true;
  rn.raw = 0;
  do {
    uVar1 = local_68[rn.raw];
    if (uVar1 != 0) {
      if (bVar4) {
        bVar4 = false;
      }
      else {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '/';
      }
      uStack_70 = 0x130e93;
      operator<<(this,rn);
      if (uVar1 != 1) {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '-';
        uStack_70 = 0x130eb6;
        operator<<(this,(Rn)(rn.raw + uVar1 + -1));
      }
    }
    rn.raw = rn.raw + uVar1 + 1;
  } while (rn.raw < 0x10);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(RegList l)
{
    int r[16];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 15; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 15; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 14; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "D0-D2/D4/D5/D7"
    bool first = true;
    for (int i = 0; i <= 15; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Rn{i}; }

        // Format variant 2: Register range
        else { *this << Rn{i} << "-" << Rn{i+r[i]-1}; }
    }

    return *this;
}